

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::SMDImporter::ParseFloat(SMDImporter *this,char *szCurrent,char **szCurrentOut,float *out)

{
  bool bVar1;
  char *pcVar2;
  float *out_local;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  bVar1 = SkipSpaces<char>((char **)&szCurrentOut_local);
  if (bVar1) {
    pcVar2 = fast_atoreal_move<float>((char *)szCurrentOut_local,out,true);
    *szCurrentOut = pcVar2;
  }
  return bVar1;
}

Assistant:

bool SMDImporter::ParseFloat(const char* szCurrent, const char** szCurrentOut, float& out) {
    if(!SkipSpaces(&szCurrent)) {
        return false;
    }

    *szCurrentOut = fast_atoreal_move<float>(szCurrent,out);
    return true;
}